

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab_cursor *ppStmt;
  byte bVar1;
  sqlite3_vtab *psVar2;
  int iVar3;
  int iVar4;
  RtreeNode *pRVar5;
  sqlite3_value *pValue;
  long lVar6;
  i64 iValue;
  u8 *puVar7;
  byte bVar8;
  sqlite3_vtab *psVar9;
  MemValue val;
  Mem *pMem;
  sqlite3_vtab *pStmt;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar9 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar9 = cur[6].pVtab;
    }
  }
  else {
    psVar9 = (sqlite3_vtab *)(cur + 8);
  }
  psVar2 = cur->pVtab;
  local_3c = 0;
  pRVar5 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_3c);
  iVar4 = local_3c;
  if ((local_3c != 0) || (iVar4 = 0, psVar9 == (sqlite3_vtab *)0x0)) goto LAB_001f667f;
  bVar8 = *(byte *)((long)&psVar9->zErrMsg + 2);
  puVar7 = pRVar5->zData;
  iVar4 = 4;
  if ((ushort)(*(ushort *)(puVar7 + 2) << 8 | *(ushort *)(puVar7 + 2) >> 8) <= (ushort)bVar8)
  goto LAB_001f667f;
  if (i == 0) {
    val.i = readInt64(puVar7 + (ulong)((uint)(byte)psVar2[1].field_0xf * (uint)bVar8) + 4);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = (i64)val;
LAB_001f6803:
      pMem->flags = 4;
    }
    else {
LAB_001f677c:
      vdbeReleaseAndSetInt64(pMem,val.i);
    }
  }
  else {
    bVar1 = psVar2[1].field_0xd;
    if ((int)(uint)bVar1 < i) {
      if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
        ppStmt = cur + 7;
        pStmt = cur[7].pVtab;
        if (pStmt == (sqlite3_vtab *)0x0) {
          iVar4 = sqlite3LockAndPrepare
                            ((sqlite3 *)psVar2[1].pModule,(char *)psVar2[4].pModule,-1,0x80,
                             (Vdbe *)0x0,(sqlite3_stmt **)ppStmt,(char **)0x0);
          if (iVar4 != 0) goto LAB_001f667f;
          pStmt = ppStmt->pVtab;
          bVar8 = *(byte *)((long)&psVar9->zErrMsg + 2);
          puVar7 = pRVar5->zData;
        }
        iValue = readInt64(puVar7 + (ulong)(byte)psVar2[1].field_0xf * (ulong)bVar8 + 4);
        sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iValue);
        iVar3 = sqlite3_step((sqlite3_stmt *)ppStmt->pVtab);
        if (iVar3 != 100) {
          sqlite3_reset((sqlite3_stmt *)ppStmt->pVtab);
          iVar4 = 0;
          if (iVar3 != 0x65) {
            iVar4 = iVar3;
          }
          goto LAB_001f667f;
        }
        *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
        bVar1 = psVar2[1].field_0xd;
      }
      pValue = sqlite3_column_value((sqlite3_stmt *)cur[7].pVtab,(i - (uint)bVar1) + 1);
      sqlite3_result_value(ctx,pValue);
    }
    else {
      lVar6 = (long)(int)((uint)(byte)psVar2[1].field_0xf * (uint)bVar8 + i * 4 + 8);
      val.i = (ulong)puVar7[lVar6 + 3] |
              (ulong)puVar7[lVar6 + 2] << 8 |
              (long)(int)((uint)puVar7[lVar6] << 0x18) | (ulong)puVar7[lVar6 + 1] << 0x10;
      if (psVar2[1].field_0xe != '\0') {
        pMem = ctx->pOut;
        if ((pMem->flags & 0x9000) == 0) {
          pMem->u = val;
          goto LAB_001f6803;
        }
        goto LAB_001f677c;
      }
      sqlite3VdbeMemSetDouble(ctx->pOut,(double)(float)val.nZero);
    }
  }
  iVar4 = 0;
LAB_001f667f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( NEVER(p==0) ) return SQLITE_OK;
  if( p->iCell>=NCELL(pNode) ) return SQLITE_ABORT;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1,
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }
  return SQLITE_OK;
}